

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall Network::Socket::BerkeleyPool::isConnected(BerkeleyPool *this,TimeOut *timeout)

{
  int iVar1;
  uint local_24;
  uint32 j;
  bool ret;
  uint32 i;
  TimeOut *timeout_local;
  BerkeleyPool *this_local;
  
  for (j = 0; j < this->size; j = j + 1) {
    (*(this->pool[j]->super_BaseSocket)._vptr_BaseSocket[0x13])(this->pool[j],1,0);
  }
  iVar1 = (*(this->super_MonitoringPool)._vptr_MonitoringPool[5])(this,timeout);
  for (local_24 = 0; local_24 < this->size; local_24 = local_24 + 1) {
    (*(this->pool[local_24]->super_BaseSocket)._vptr_BaseSocket[0x13])(this->pool[local_24],1);
  }
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool BerkeleyPool::isConnected(const Time::TimeOut & timeout)
        {
            for (uint32 i = 0; i < size; i++) pool[i]->setOption(BaseSocket::Blocking, 0);
            bool ret = isReadPossible(timeout);
            for (uint32 j = 0; j < size; j++) pool[j]->setOption(BaseSocket::Blocking, 1);
            return ret;
        }